

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_item_t_conflict add_item(MIR_context_t ctx,MIR_item_t_conflict item)

{
  MIR_item_type_t MVar1;
  int iVar2;
  MIR_item_type_t MVar3;
  MIR_func_t pMVar4;
  char *pcVar5;
  MIR_error_type_t MVar6;
  MIR_context_t ctx_00;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict tab_item_1;
  MIR_item item_s;
  MIR_item_t_conflict local_f8;
  MIR_item_t_conflict local_f0;
  MIR_item_t_conflict local_e8 [17];
  MIR_item local_60;
  
  local_f8 = item;
  local_e8[0] = (MIR_item_t_conflict)MIR_item_name(ctx,item);
  local_60.module = item->module;
  ctx_00 = (MIR_context_t)ctx->module_item_tab;
  local_60.u.func = (MIR_func_t)local_e8;
  local_60.item_type = MIR_func_item;
  iVar2 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)ctx_00,&local_60,HTAB_FIND,&local_f0);
  if (local_f0 == (MIR_item_t_conflict)0x0 || iVar2 == 0) {
    DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
    HTAB_MIR_item_t_do(ctx->module_item_tab,item,HTAB_INSERT,&local_f8);
    return local_f8;
  }
  MVar3 = local_f0->item_type;
  switch(MVar3) {
  case MIR_func_item:
  case MIR_data_item:
  case MIR_ref_data_item:
  case MIR_lref_data_item:
  case MIR_expr_data_item:
  case MIR_bss_item:
    MVar3 = item->item_type;
    if (MVar3 == MIR_export_item) {
      if (local_f0->export_p != '\0') {
        return local_f0;
      }
      local_f0->export_p = '\x01';
LAB_00130d49:
      DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
      item->ref_def = local_f0;
      return local_f8;
    }
    if (MVar3 == MIR_forward_item) goto LAB_00130d49;
    if (MVar3 == MIR_import_item) {
      pMVar4 = (item->u).func;
      pcVar5 = "import of local definition %s";
      goto LAB_00130eb9;
    }
    ctx = (MIR_context_t)ctx->error_func;
    pcVar5 = MIR_item_name(ctx_00,item);
    (*(code *)ctx)(0x10,"Repeated item declaration %s",pcVar5);
  case MIR_proto_item:
    pcVar5 = "item %s was already defined as proto";
    MVar6 = MIR_repeated_decl_error;
    pMVar4 = (MIR_func_t)((local_f0->u).func)->name;
    break;
  case MIR_import_item:
    if (item->item_type == MIR_import_item) {
      return local_f0;
    }
    pMVar4 = (local_f0->u).func;
    pcVar5 = "existing module definition %s already defined as import";
    goto LAB_00130eb9;
  case MIR_export_item:
  case MIR_forward_item:
    MVar1 = item->item_type;
    if (MVar1 - MIR_export_item < 2) {
      if (MVar3 == MVar1) {
        local_f8 = local_f0;
        item = local_f0;
      }
      else {
        DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
        MVar3 = item->item_type;
      }
      if (MVar3 != MIR_export_item) {
        return local_f8;
      }
      if (local_f0->item_type != MIR_forward_item) {
        return local_f8;
      }
      local_f0->ref_def = item;
LAB_00130de7:
      local_e8[0] = local_f0;
      HTAB_MIR_item_t_do(ctx->module_item_tab,local_f0,HTAB_DELETE,local_e8);
      HTAB_MIR_item_t_do(ctx->module_item_tab,item,HTAB_INSERT,local_e8);
      if (item != local_e8[0]) {
        __assert_fail("item == tab_item",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x3f4,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
      }
      return local_f8;
    }
    if (MVar1 != MIR_import_item) {
      DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
      local_f0->ref_def = item;
      if (local_f0->item_type == MIR_export_item) {
        item->export_p = '\x01';
      }
      goto LAB_00130de7;
    }
    pMVar4 = (item->u).func;
    pcVar5 = "export/forward of import %s";
LAB_00130eb9:
    MVar6 = MIR_import_export_error;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x414,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
  }
  (*ctx->error_func)(MVar6,pcVar5,pMVar4);
  if (0xb < (uint)pcVar5) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x477,"size_t _MIR_type_size(MIR_context_t, MIR_type_t)");
  }
  return *(MIR_item_t_conflict *)(&DAT_001acaf0 + ((ulong)pcVar5 & 0xffffffff) * 8);
}

Assistant:

static MIR_item_t add_item (MIR_context_t ctx, MIR_item_t item) {
  int replace_p;
  MIR_item_t tab_item;

  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), item->module)) == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, item);
    return item;
  }
  switch (tab_item->item_type) {
  case MIR_import_item:
    if (item->item_type != MIR_import_item)
      MIR_get_error_func (ctx) (MIR_import_export_error,
                                "existing module definition %s already defined as import",
                                tab_item->u.import_id);
    item = tab_item;
    break;
  case MIR_export_item:
  case MIR_forward_item:
    replace_p = FALSE;
    if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "export/forward of import %s",
                                item->u.import_id);
    } else if (item->item_type != MIR_export_item && item->item_type != MIR_forward_item) {
      replace_p = TRUE;
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
    } else {
      if (tab_item->item_type == item->item_type)
        item = tab_item;
      else
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
      if (item->item_type == MIR_export_item && tab_item->item_type == MIR_forward_item)
        replace_p = TRUE;
    }
    if (replace_p) { /* replace forward by export or export/forward by its definition: */
      tab_item->ref_def = item;
      if (tab_item->item_type == MIR_export_item) item->export_p = TRUE;
      item_tab_remove (ctx, tab_item);
      tab_item = item_tab_insert (ctx, item);
      mir_assert (item == tab_item);
    }
    break;
  case MIR_proto_item:
    MIR_get_error_func (ctx) (MIR_repeated_decl_error, "item %s was already defined as proto",
                              tab_item->u.proto->name);
    break;
  case MIR_bss_item:
  case MIR_data_item:
  case MIR_ref_data_item:
  case MIR_lref_data_item:
  case MIR_expr_data_item:
  case MIR_func_item:
    if (item->item_type == MIR_export_item) {
      if (tab_item->export_p) {
        item = tab_item;
      } else { /* just keep one export: */
        tab_item->export_p = TRUE;
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
        item->ref_def = tab_item;
      }
    } else if (item->item_type == MIR_forward_item) {
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
      item->ref_def = tab_item;
    } else if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "import of local definition %s",
                                item->u.import_id);
    } else {
      MIR_get_error_func (ctx) (MIR_repeated_decl_error, "Repeated item declaration %s",
                                MIR_item_name (ctx, item));
    }
    break;
  default: mir_assert (FALSE);
  }
  return item;
}